

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

ECOLOR_FORMAT __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::getBestColorFormat
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,ECOLOR_FORMAT format)

{
  ulong uVar1;
  ECOLOR_FORMAT in_ESI;
  long in_RDI;
  ECOLOR_FORMAT destFormat;
  ECOLOR_FORMAT local_1c;
  ECOLOR_FORMAT local_10;
  
  local_1c = in_ESI;
  if ((int)in_ESI < 4) {
    local_1c = ECF_A8R8G8B8;
  }
  local_10 = local_1c;
  switch(in_ESI) {
  case ECF_A1R5G5B5:
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),2);
    if ((uVar1 & 1) == 0) {
      local_10 = ECF_A1R5G5B5;
    }
    break;
  case ECF_R5G6B5:
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),2);
    if ((uVar1 & 1) == 0) {
      local_10 = ECF_R5G6B5;
    }
    break;
  case ECF_R8G8B8:
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),1);
    if (((uVar1 & 1) != 0) ||
       (uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),8),
       (uVar1 & 1) != 0)) {
      local_10 = ECF_A1R5G5B5;
    }
    break;
  case ECF_A8R8G8B8:
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),1);
    if (((uVar1 & 1) != 0) ||
       (uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),8),
       (uVar1 & 1) != 0)) {
      local_10 = ECF_A1R5G5B5;
    }
  }
  uVar1 = (**(code **)(**(long **)(in_RDI + 0x78) + 0x220))(*(long **)(in_RDI + 0x78),0x20);
  if ((uVar1 & 1) != 0) {
    if (local_10 == ECF_A1R5G5B5) {
      local_10 = ECF_R5G6B5;
    }
    else if (local_10 == ECF_A8R8G8B8) {
      local_10 = ECF_R8G8B8;
    }
  }
  return local_10;
}

Assistant:

ECOLOR_FORMAT getBestColorFormat(ECOLOR_FORMAT format)
	{
		// We only try for to adapt "simple" formats
		ECOLOR_FORMAT destFormat = (format <= ECF_A8R8G8B8) ? ECF_A8R8G8B8 : format;

		switch (format) {
		case ECF_A1R5G5B5:
			if (!Driver->getTextureCreationFlag(ETCF_ALWAYS_32_BIT))
				destFormat = ECF_A1R5G5B5;
			break;
		case ECF_R5G6B5:
			if (!Driver->getTextureCreationFlag(ETCF_ALWAYS_32_BIT))
				destFormat = ECF_R5G6B5;
			break;
		case ECF_A8R8G8B8:
			if (Driver->getTextureCreationFlag(ETCF_ALWAYS_16_BIT) ||
					Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				destFormat = ECF_A1R5G5B5;
			break;
		case ECF_R8G8B8:
			// Note: Using ECF_A8R8G8B8 even when ETCF_ALWAYS_32_BIT is not set as 24 bit textures fail with too many cards
			if (Driver->getTextureCreationFlag(ETCF_ALWAYS_16_BIT) || Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				destFormat = ECF_A1R5G5B5;
		default:
			break;
		}

		if (Driver->getTextureCreationFlag(ETCF_NO_ALPHA_CHANNEL)) {
			switch (destFormat) {
			case ECF_A1R5G5B5:
				destFormat = ECF_R5G6B5;
				break;
			case ECF_A8R8G8B8:
				destFormat = ECF_R8G8B8;
				break;
			default:
				break;
			}
		}

		return destFormat;
	}